

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_8,_true>_>::TestBody
          (UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  bool bVar1;
  anon_enum_32 *lhs;
  char *rhs_expression;
  char *lhs_expression;
  AssertHelper *this_00;
  char *in_RDI;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  int line;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_> *in_stack_ffffffffffffffd0;
  AssertionResult local_20;
  undefined2 local_e;
  undefined2 local_c;
  undefined1 local_9;
  
  lhs = (anon_enum_32 *)(in_RDI + 0x330);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x330));
  local_9 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type_conflict2 *)0x5c5a44);
  rhs_expression = in_RDI + 0x2e8;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x2e8));
  local_c = 0x80;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::assign
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,(value_type_conflict3 *)0x5c5a7c);
  lhs_expression = in_RDI + 0x2d0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x2e8));
  local_e = 0x80;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::assign
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,(value_type_conflict3 *)0x5c5ab4);
  NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_>::NoiseModelUpdate
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (lhs_expression,rhs_expression,lhs,(int *)in_stack_ffffffffffffff90);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5c5b1c)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_RDI,line,rhs_expression);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x5c5b6a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c5bba);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForZeroNoiseAllFlat) {
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  this->denoised_.assign(this->denoised_.size(), 128);
  this->data_.assign(this->denoised_.size(), 128);
  EXPECT_EQ(AOM_NOISE_STATUS_INTERNAL_ERROR, this->NoiseModelUpdate());
}